

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O0

void __thiscall
aggreports::FillWheatsheafItems
          (aggreports *this,outkey2 key,
          map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
          *items,OASIS_FLOAT loss,
          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *maxPeriodNo,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *unusedperiodstoweighting)

{
  mapped_type_conflict1 mVar1;
  int iVar2;
  bool bVar3;
  pointer ppVar4;
  mapped_type_conflict1 *pmVar5;
  mapped_type *this_00;
  _Self local_80;
  _Self local_78;
  iterator iter;
  lossval lv;
  wheatkey wk;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *unusedperiodstoweighting_local;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *maxPeriodNo_local;
  OASIS_FLOAT loss_local;
  map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
  *items_local;
  aggreports *this_local;
  undefined8 local_14;
  outkey2 key_local;
  
  lv._20_4_ = key.sidx;
  local_14._0_4_ = (OASIS_FLOAT)key.summary_id;
  lv.value = (OASIS_FLOAT)local_14;
  lv.period_weighting._0_4_ = loss;
  local_14 = key._0_8_;
  key_local.summary_id = lv._20_4_;
  local_78._M_node =
       (_Base_ptr)
       std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::find
                 (&this->periodstoweighting_,(key_type *)((long)&local_14 + 4));
  local_80._M_node =
       (_Base_ptr)
       std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::end
                 (&this->periodstoweighting_);
  bVar3 = std::operator!=(&local_78,&local_80);
  if (bVar3) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_double>_>::operator->(&local_78);
    lv._0_8_ = ppVar4->second;
    iVar2 = local_14._4_4_;
    iter._M_node._0_4_ = local_14._4_4_;
    pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[](maxPeriodNo,(key_type *)&local_14);
    mVar1 = (mapped_type_conflict1)iter._M_node;
    if (*pmVar5 < iVar2) {
      pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](maxPeriodNo,(key_type *)&local_14);
      *pmVar5 = mVar1;
    }
    this_00 = std::
              map<wheatkey,_std::vector<lossval,_std::allocator<lossval>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<lossval,_std::allocator<lossval>_>_>_>_>
              ::operator[](items,(key_type *)&lv.value);
    std::vector<lossval,_std::allocator<lossval>_>::push_back(this_00,(value_type *)&iter);
  }
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::erase
            (unusedperiodstoweighting,(key_type *)((long)&local_14 + 4));
  return;
}

Assistant:

inline void aggreports::FillWheatsheafItems(const outkey2 key,
	std::map<wheatkey, lossvec2> &items, const OASIS_FLOAT loss,
	std::map<int, int> &maxPeriodNo,
	std::map<int, double> &unusedperiodstoweighting) {

  wheatkey wk;
  wk.sidx = key.sidx;
  wk.summary_id = key.summary_id;
  lossval lv;
  lv.value = loss;
  auto iter = periodstoweighting_.find(key.period_no);
  if (iter != periodstoweighting_.end()) {
    lv.period_weighting = iter->second;
    lv.period_no = key.period_no;
    if (lv.period_no > maxPeriodNo[key.summary_id]) {
	maxPeriodNo[key.summary_id] = lv.period_no;
    }
    items[wk].push_back(lv);
  }
  unusedperiodstoweighting.erase(key.period_no);

}